

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O2

void check_sockname(sockaddr *addr,char *compare_ip,int compare_port,char *context)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  char check_ip [17];
  sockaddr_in check_addr;
  int64_t eval_b_4;
  sockaddr_in compare_addr;
  
  check_addr._0_8_ = *(undefined8 *)addr;
  check_addr.sin_zero = *(uchar (*) [8])(addr->sa_data + 6);
  iVar1 = uv_ip4_addr(compare_ip,compare_port,&compare_addr);
  uVar2 = (ulong)iVar1;
  eval_b = 0;
  if (uVar2 == 0) {
    uVar2 = check_addr._0_8_ & 0xffff;
    eval_b = 2;
    if (uVar2 == 2) {
      uVar2 = (ulong)compare_addr.sin_family;
      eval_b = 2;
      check_ip._0_8_ = uVar2;
      if (uVar2 == 2) {
        iVar1 = memcmp(&check_addr.sin_addr,&compare_addr.sin_addr,4);
        uVar2 = (ulong)iVar1;
        eval_b = 0;
        check_ip._0_8_ = uVar2;
        if (uVar2 == 0) {
          if ((compare_port != 0) && (check_addr.sin_port != compare_addr.sin_port)) {
            fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
                    ,99,"compare_port == 0 || check_addr.sin_port == compare_addr.sin_port");
            abort();
          }
          iVar1 = uv_ip4_name(&check_addr,check_ip,0x11);
          uVar2 = (ulong)iVar1;
          if (uVar2 == 0) {
            printf("%s: %s:%d\n",context,check_ip,
                   (ulong)(ushort)(check_addr.sin_port << 8 | check_addr.sin_port >> 8));
            return;
          }
          pcVar4 = "0";
          pcVar3 = "r";
          uVar5 = 0x66;
          eval_b = 0;
        }
        else {
          pcVar4 = "0";
          pcVar3 = 
          "memcmp(&check_addr.sin_addr, &compare_addr.sin_addr, sizeof compare_addr.sin_addr)";
          uVar5 = 0x60;
        }
      }
      else {
        pcVar4 = "2";
        pcVar3 = "compare_addr.sin_family";
        uVar5 = 0x5b;
      }
    }
    else {
      pcVar4 = "2";
      pcVar3 = "check_addr.sin_family";
      uVar5 = 0x5a;
      check_ip._0_8_ = uVar2;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(compare_ip, compare_port, &compare_addr)";
    uVar5 = 0x57;
    check_ip._0_8_ = uVar2;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
          ,uVar5,pcVar3,"==",pcVar4,uVar2,"==",eval_b);
  abort();
}

Assistant:

static void check_sockname(struct sockaddr* addr, const char* compare_ip,
  int compare_port, const char* context) {
  struct sockaddr_in check_addr = *(struct sockaddr_in*) addr;
  struct sockaddr_in compare_addr;
  char check_ip[17];
  int r;

  ASSERT_OK(uv_ip4_addr(compare_ip, compare_port, &compare_addr));

  /* Both addresses should be ipv4 */
  ASSERT_EQ(check_addr.sin_family, AF_INET);
  ASSERT_EQ(compare_addr.sin_family, AF_INET);

  /* Check if the ip matches */
  ASSERT_OK(memcmp(&check_addr.sin_addr,
            &compare_addr.sin_addr,
            sizeof compare_addr.sin_addr));

  /* Check if the port matches. If port == 0 anything goes. */
  ASSERT(compare_port == 0 || check_addr.sin_port == compare_addr.sin_port);

  r = uv_ip4_name(&check_addr, (char*) check_ip, sizeof check_ip);
  ASSERT_OK(r);

  printf("%s: %s:%d\n", context, check_ip, ntohs(check_addr.sin_port));
}